

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringAlgorithms.h
# Opt level: O0

string * cmStrCat<char[23],std::__cxx11::string,char[23],std::__cxx11::string,char[23],int,char[3],char_const*,char[4]>
                   (string *__return_storage_ptr__,cmAlphaNum *a,cmAlphaNum *b,char (*args) [23],
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1,
                   char (*args_2) [23],
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_3,
                   char (*args_4) [23],int *args_5,char (*args_6) [3],char **args_7,
                   char (*args_8) [4])

{
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  cmAlphaNum local_2a8;
  cmAlphaNum local_278;
  cmAlphaNum local_248;
  cmAlphaNum local_218;
  cmAlphaNum local_1e8;
  cmAlphaNum local_1b8;
  cmAlphaNum local_188;
  cmAlphaNum local_158;
  cmAlphaNum local_128;
  string_view local_f8;
  string_view local_e8;
  string_view local_d8;
  string_view local_c8;
  string_view local_b8;
  string_view local_a8;
  string_view local_98;
  string_view local_88;
  string_view local_78;
  string_view local_68;
  string_view local_58;
  iterator local_48;
  undefined8 local_40;
  char (*local_38) [23];
  char (*args_local_2) [23];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_local_1;
  char (*args_local) [23];
  cmAlphaNum *b_local;
  cmAlphaNum *a_local;
  
  local_38 = args_2;
  args_local_2 = (char (*) [23])args_1;
  args_local_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args;
  args_local = (char (*) [23])b;
  b_local = a;
  a_local = (cmAlphaNum *)__return_storage_ptr__;
  local_f8 = cmAlphaNum::View(a);
  local_e8 = cmAlphaNum::View((cmAlphaNum *)args_local);
  cmAlphaNum::cmAlphaNum(&local_128,(char *)args_local_1);
  local_d8 = cmAlphaNum::View(&local_128);
  cmAlphaNum::cmAlphaNum(&local_158,(string *)args_local_2);
  local_c8 = cmAlphaNum::View(&local_158);
  cmAlphaNum::cmAlphaNum(&local_188,*local_38);
  local_b8 = cmAlphaNum::View(&local_188);
  cmAlphaNum::cmAlphaNum(&local_1b8,args_3);
  local_a8 = cmAlphaNum::View(&local_1b8);
  cmAlphaNum::cmAlphaNum(&local_1e8,*args_4);
  local_98 = cmAlphaNum::View(&local_1e8);
  cmAlphaNum::cmAlphaNum(&local_218,*args_5);
  local_88 = cmAlphaNum::View(&local_218);
  cmAlphaNum::cmAlphaNum(&local_248,*args_6);
  local_78 = cmAlphaNum::View(&local_248);
  cmAlphaNum::cmAlphaNum(&local_278,*args_7);
  local_68 = cmAlphaNum::View(&local_278);
  cmAlphaNum::cmAlphaNum(&local_2a8,*args_8);
  local_58 = cmAlphaNum::View(&local_2a8);
  local_48 = &local_f8;
  local_40 = 0xb;
  views._M_len = 0xb;
  views._M_array = local_48;
  cmCatViews_abi_cxx11_(__return_storage_ptr__,views);
  return __return_storage_ptr__;
}

Assistant:

inline std::string cmStrCat(cmAlphaNum const& a, cmAlphaNum const& b,
                            AV const&... args)
{
  return cmCatViews(
    { a.View(), b.View(), static_cast<cmAlphaNum const&>(args).View()... });
}